

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAbbrev.cpp
# Opt level: O0

void __thiscall llvm::DWARFDebugAbbrev::DWARFDebugAbbrev(DWARFDebugAbbrev *this)

{
  DWARFDebugAbbrev *this_local;
  
  std::
  map<unsigned_long,_llvm::DWARFAbbreviationDeclarationSet,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFAbbreviationDeclarationSet>_>_>
  ::map(&this->AbbrDeclSets);
  std::
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_llvm::DWARFAbbreviationDeclarationSet>_>::
  _Rb_tree_const_iterator(&this->PrevAbbrOffsetPos);
  Optional<llvm::DataExtractor>::Optional(&this->Data);
  clear(this);
  return;
}

Assistant:

DWARFDebugAbbrev::DWARFDebugAbbrev() { clear(); }